

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubD::AddVertexForExperts
          (ON_SubD *this,uint candidate_vertex_id,ON_SubDVertexTag vertex_tag,double *P,
          uint initial_edge_capacity,uint initial_face_capacity)

{
  uint level;
  ON_SubDimple *this_00;
  ON_SubDVertex *v;
  ON_SubDimple *subdimple;
  uint initial_face_capacity_local;
  uint initial_edge_capacity_local;
  double *P_local;
  ON_SubDVertexTag vertex_tag_local;
  uint candidate_vertex_id_local;
  ON_SubD *this_local;
  
  this_00 = SubDimple(this,true);
  if (this_00 == (ON_SubDimple *)0x0) {
    this_local = (ON_SubD *)0x0;
  }
  else {
    level = ON_SubDimple::ActiveLevelIndex(this_00);
    this_local = (ON_SubD *)
                 ON_SubDimple::AllocateVertex
                           (this_00,candidate_vertex_id,vertex_tag,level,P,initial_edge_capacity,
                            initial_face_capacity);
    ON_SubDimple::AddVertexToLevel(this_00,(ON_SubDVertex *)this_local);
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

ON_SubDVertex* ON_SubD::AddVertexForExperts(
  unsigned int candidate_vertex_id,
  ON_SubDVertexTag vertex_tag,
  const double* P,
  unsigned int initial_edge_capacity,
  unsigned int initial_face_capacity
)
{
  ON_SubDimple* subdimple = SubDimple(true);
  if (0 == subdimple)
    return 0;
  ON_SubDVertex* v = subdimple->AllocateVertex( candidate_vertex_id, vertex_tag, subdimple->ActiveLevelIndex(), P, initial_edge_capacity, initial_face_capacity);
  subdimple->AddVertexToLevel(v);
  return v;
}